

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormatLite::WriteSFixed32ToArray
                    (int field_number,int32_t value,uint8_t *target)

{
  bool bVar1;
  uint uVar2;
  int32_t *piVar3;
  uint uVar4;
  
  uVar4 = field_number * 8;
  *target = (byte)uVar4 + 5;
  if (uVar4 < 0x80) {
    piVar3 = (int32_t *)(target + 1);
  }
  else {
    *target = (byte)uVar4 | 0x85;
    target[1] = (uint8_t)(uVar4 >> 7);
    piVar3 = (int32_t *)(target + 2);
    if (0x3fff < uVar4) {
      uVar2 = (uint)target[1];
      uVar4 = uVar4 >> 7;
      do {
        *(byte *)((long)piVar3 + -1) = (byte)uVar2 | 0x80;
        uVar2 = uVar4 >> 7;
        *(uint8_t *)piVar3 = (uint8_t)uVar2;
        piVar3 = (int32_t *)((long)piVar3 + 1);
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar2;
      } while (bVar1);
    }
  }
  *piVar3 = value;
  return (uint8_t *)(piVar3 + 1);
}

Assistant:

constexpr inline uint32_t WireFormatLite::MakeTag(int field_number,
                                                  WireType type) {
  return GOOGLE_PROTOBUF_WIRE_FORMAT_MAKE_TAG(field_number, type);
}